

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_util.h
# Opt level: O1

void bin_update_shard_size_cold_1(void)

{
  long lVar1;
  int iVar2;
  int *in_RSI;
  long in_RDI;
  undefined8 uStack_8;
  
  if (in_RDI == 1) {
    uStack_8 = 1;
  }
  else {
    lVar1 = 0x3f;
    if (in_RDI - 1U != 0) {
      for (; in_RDI - 1U >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uStack_8 = 1L << ((char)lVar1 + 1U & 0x3f);
  }
  lVar1 = 0x3f;
  if (uStack_8 != 0) {
    for (; uStack_8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  iVar2 = (uint)lVar1 - 3;
  if ((uint)lVar1 < 3) {
    iVar2 = 0;
  }
  *in_RSI = iVar2;
  return;
}

Assistant:

BIT_UTIL_INLINE uint64_t
pow2_ceil_u64(uint64_t x) {
#if (defined(__amd64__) || defined(__x86_64__) || defined(JEMALLOC_HAVE_BUILTIN_CLZ))
	if(unlikely(x <= 1)) {
		return x;
	}
	size_t msb_on_index;
#if (defined(__amd64__) || defined(__x86_64__))
	asm ("bsrq %1, %0"
			: "=r"(msb_on_index) // Outputs.
			: "r"(x-1)           // Inputs.
		);
#elif (defined(JEMALLOC_HAVE_BUILTIN_CLZ))
	msb_on_index = (63 ^ __builtin_clzll(x - 1));
#endif
	assert(msb_on_index < 63);
	return 1ULL << (msb_on_index + 1);
#else
	x--;
	x |= x >> 1;
	x |= x >> 2;
	x |= x >> 4;
	x |= x >> 8;
	x |= x >> 16;
	x |= x >> 32;
	x++;
	return x;
#endif
}